

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_parser_test.cpp
# Opt level: O0

void __thiscall read_binary_from_file<double>::test_method(read_binary_from_file<double> *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  undefined4 local_2fc;
  size_type local_2f8;
  undefined8 local_2e9;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  local_2e0;
  assertion_result local_2d0;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_278;
  undefined4 local_254;
  size_type local_250;
  undefined8 local_241;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  local_238;
  assertion_result local_228;
  basic_cstring<const_char> local_210;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1d0;
  undefined4 local_1ac;
  size_type local_1a8;
  undefined8 local_199;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  local_190;
  assertion_result local_180;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  undefined1 *local_148;
  basic_solid<double> *s;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  bool local_f9;
  value_expr<bool_&> local_f8;
  assertion_result local_f0;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  undefined1 local_b8 [8];
  pair<tyti::stl::basic_solid<double>,_bool> out;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string test_data;
  read_binary_from_file<double> *this_local;
  
  test_data.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/testdata/cube_binary.stl"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  tyti::stl::read<double>((pair<tyti::stl::basic_solid<double>,_bool> *)local_b8,(string *)local_30)
  ;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c8,0x37,&local_d8);
    boost::test_tools::assertion::seed::operator->*((seed *)&local_f8,&local_f9);
    boost::test_tools::assertion::value_expr<bool_&>::evaluate(&local_f0,&local_f8,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,"out.second",10);
    boost::unit_test::operator<<(&local_120,plVar3,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&s,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_f0,&local_120.super_lazy_ostream,(const_string *)&s,0x37,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_148 = local_b8;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_158,0x3a,&local_168);
    local_1a8 = std::
                vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                ::size((vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        *)(local_148 + 0x20));
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_199 + 1),&local_199);
    local_1ac = 0xc;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>
                *)&local_190,(int *)((long)&local_199 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
    ::evaluate(&local_180,&local_190,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,"s.normals.size() == 12",0x16);
    boost::unit_test::operator<<(&local_1d0,plVar3,&local_1e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_180,&local_1d0.super_lazy_ostream,&local_1f0,0x3a,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1d0);
    boost::test_tools::assertion_result::~assertion_result(&local_180);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_210);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_200,0x3b,&local_210);
    local_250 = std::
                vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                ::size((vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        *)(local_148 + 0x38));
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_241 + 1),&local_241);
    local_254 = 0x24;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>
                *)&local_238,(int *)((long)&local_241 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
    ::evaluate(&local_228,&local_238,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,"s.vertices.size() == 3 * 12",0x1b);
    boost::unit_test::operator<<(&local_278,plVar3,&local_288);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_228,&local_278.super_lazy_ostream,&local_298,0x3b,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_278);
    boost::test_tools::assertion_result::~assertion_result(&local_228);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2a8,0x3c,&local_2b8);
    local_2f8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           (local_148 + 0x50));
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_2e9 + 1),&local_2e9);
    local_2fc = 0xc;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>
                *)&local_2e0,(int *)((long)&local_2e9 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
    ::evaluate(&local_2d0,&local_2e0,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,"s.attributes.size() == 12",0x19);
    boost::unit_test::operator<<(&local_320,plVar3,&local_330);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_2d0,&local_320.super_lazy_ostream,&local_340,0x3c,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_2d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::pair<tyti::stl::basic_solid<double>,_bool>::~pair
            ((pair<tyti::stl::basic_solid<double>,_bool> *)local_b8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(read_binary_from_file, T, test_types)
{
    const std::string test_data{  SOURCE_DIR "/testdata/cube_binary.stl" };

    auto out = stl::read<T>(test_data);
    BOOST_TEST(out.second);
    stl::basic_solid<T>& s = out.first;

    BOOST_TEST(s.normals.size() == 12);
    BOOST_TEST(s.vertices.size() == 3 * 12);
    BOOST_TEST(s.attributes.size() == 12);
}